

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O3

void * stbi__jpeg_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  undefined8 *puVar2;
  stbi_uc *psVar3;
  short sVar4;
  stbi__uint32 sVar5;
  stbi__uint32 sVar6;
  undefined8 uVar7;
  bool bVar8;
  short sVar9;
  stbi_uc sVar10;
  byte bVar11;
  stbi_uc sVar12;
  stbi_uc sVar13;
  stbi_uc sVar14;
  byte bVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  stbi__jpeg *j;
  char *pcVar21;
  void *pvVar22;
  short *psVar23;
  code *pcVar24;
  uint uVar25;
  ulong uVar26;
  short sVar27;
  uint extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  uint extraout_EDX_02;
  uint extraout_EDX_03;
  uint extraout_EDX_04;
  uint extraout_EDX_05;
  uint extraout_EDX_06;
  uint extraout_EDX_07;
  uint extraout_EDX_08;
  int extraout_EDX_09;
  int extraout_EDX_10;
  anon_struct_96_18_0d0905d3 *extraout_RDX;
  anon_struct_96_18_0d0905d3 *extraout_RDX_00;
  anon_struct_96_18_0d0905d3 *extraout_RDX_01;
  anon_struct_96_18_0d0905d3 *extraout_RDX_02;
  anon_struct_96_18_0d0905d3 *extraout_RDX_03;
  anon_struct_96_18_0d0905d3 *extraout_RDX_04;
  anon_struct_96_18_0d0905d3 *extraout_RDX_05;
  anon_struct_96_18_0d0905d3 *extraout_RDX_06;
  anon_struct_96_18_0d0905d3 *extraout_RDX_07;
  anon_struct_96_18_0d0905d3 *extraout_RDX_08;
  anon_struct_96_18_0d0905d3 *extraout_RDX_09;
  long extraout_RDX_10;
  long extraout_RDX_11;
  anon_struct_96_18_0d0905d3 *extraout_RDX_12;
  long extraout_RDX_13;
  anon_struct_96_18_0d0905d3 *extraout_RDX_14;
  anon_struct_96_18_0d0905d3 *paVar28;
  anon_struct_96_18_0d0905d3 *extraout_RDX_15;
  anon_struct_96_18_0d0905d3 *extraout_RDX_16;
  ulong extraout_RDX_17;
  ulong extraout_RDX_18;
  long extraout_RDX_19;
  stbi_uc *psVar29;
  stbi_uc *extraout_RDX_20;
  stbi_uc *extraout_RDX_21;
  long lVar30;
  ulong uVar31;
  int *piVar32;
  int iVar33;
  stbi__context *psVar34;
  uint uVar35;
  ulong uVar36;
  int *piVar37;
  int iVar38;
  int iVar39;
  long lVar40;
  long in_FS_OFFSET;
  bool bVar41;
  undefined1 auVar42 [16];
  stbi_uc *coutput [4];
  short data [64];
  long local_188;
  long local_180;
  long local_160;
  int local_14c;
  stbi_uc *local_138 [3];
  long lStack_120;
  int *local_110;
  long local_108;
  stbi__uint32 *local_100;
  short local_f8 [4];
  undefined8 local_f0 [2];
  int local_e0 [44];
  
  j = (stbi__jpeg *)calloc(1,0x4888);
  if (j == (stbi__jpeg *)0x0) {
    *(char **)(in_FS_OFFSET + -8) = "outofmem";
    return (void *)0x0;
  }
  j->s = s;
  j->idct_block_kernel = stbi__idct_simd;
  j->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  j->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  s->img_n = 0;
  j->app14_color_transform = -1;
  j->marker = 0xff;
  sVar10 = stbi__get_marker(j);
  if (sVar10 != 0xd8) {
    pcVar21 = "no SOI";
    paVar28 = extraout_RDX;
    goto LAB_00111a8f;
  }
  local_110 = comp;
  local_100 = (stbi__uint32 *)y;
  bVar11 = stbi__get_marker(j);
  if (bVar11 != 0xc2 && (bVar11 & 0xfe) != 0xc0) {
    do {
      iVar16 = stbi__process_marker(j,(uint)bVar11);
      uVar25 = extraout_EDX;
      if (iVar16 == 0) goto LAB_00111a98;
LAB_0011194e:
      bVar11 = stbi__get_marker(j);
      if (bVar11 == 0xff) {
        psVar34 = j->s;
        paVar28 = extraout_RDX_00;
        if ((psVar34->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) goto code_r0x00111964;
        goto LAB_0011197b;
      }
    } while ((bVar11 != 0xc2) && ((bVar11 & 0xfe) != 0xc0));
  }
  j->progressive = (uint)(bVar11 == 0xc2);
  psVar34 = j->s;
  sVar10 = stbi__get8(psVar34);
  sVar12 = stbi__get8(psVar34);
  paVar28 = extraout_RDX_02;
  if (CONCAT11(sVar10,sVar12) < 0xb) {
LAB_001119d4:
    pcVar21 = "bad SOF len";
    goto LAB_00111a8f;
  }
  sVar13 = stbi__get8(psVar34);
  if (sVar13 != '\b') {
    pcVar21 = "only 8-bit";
    paVar28 = extraout_RDX_03;
    goto LAB_00111a8f;
  }
  sVar13 = stbi__get8(psVar34);
  sVar14 = stbi__get8(psVar34);
  psVar34->img_y = (uint)CONCAT11(sVar13,sVar14);
  if (CONCAT11(sVar13,sVar14) == 0) {
    pcVar21 = "no header height";
    paVar28 = extraout_RDX_04;
    goto LAB_00111a8f;
  }
  sVar13 = stbi__get8(psVar34);
  sVar14 = stbi__get8(psVar34);
  psVar34->img_x = (uint)CONCAT11(sVar13,sVar14);
  paVar28 = extraout_RDX_05;
  if (CONCAT11(sVar13,sVar14) == 0) {
    pcVar21 = "0 width";
    goto LAB_00111a8f;
  }
  if (0x1000000 < psVar34->img_y) {
LAB_00111a6d:
    pcVar21 = "too large";
    goto LAB_00111a8f;
  }
  bVar11 = stbi__get8(psVar34);
  if ((4 < bVar11) || ((0x1aU >> (bVar11 & 0x1f) & 1) == 0)) {
    pcVar21 = "bad component count";
    paVar28 = extraout_RDX_06;
    goto LAB_00111a8f;
  }
  paVar1 = j->img_comp;
  psVar34->img_n = (uint)bVar11;
  uVar26 = (ulong)bVar11;
  paVar28 = (anon_struct_96_18_0d0905d3 *)&j->img_comp[0].data;
  do {
    paVar28->id = 0;
    paVar28->h = 0;
    paVar28->dc_pred = 0;
    paVar28->x = 0;
    paVar28 = paVar28 + 1;
    uVar26 = uVar26 - 1;
  } while (uVar26 != 0);
  if (CONCAT11(sVar10,sVar12) != (ushort)((ushort)bVar11 + (ushort)bVar11 * 2 + 8))
  goto LAB_001119d4;
  j->rgb = 0;
  piVar37 = &j->img_comp[0].tq;
  lVar40 = 0;
  do {
    bVar11 = stbi__get8(psVar34);
    ((anon_struct_96_18_0d0905d3 *)(piVar37 + -3))->id = (uint)bVar11;
    if ((psVar34->img_n == 3) && (bVar11 == (&stbi__process_frame_header_rgb)[lVar40])) {
      j->rgb = j->rgb + 1;
    }
    bVar11 = stbi__get8(psVar34);
    piVar37[-2] = (uint)(bVar11 >> 4);
    paVar28 = extraout_RDX_07;
    if ((byte)(bVar11 + 0xb0) < 0xc0) goto LAB_00111c55;
    piVar37[-1] = bVar11 & 0xf;
    if ((bVar11 & 0xf) - 5 < 0xfffffffc) goto LAB_00111c61;
    bVar11 = stbi__get8(psVar34);
    *piVar37 = (uint)bVar11;
    if (3 < bVar11) {
      pcVar21 = "bad TQ";
      paVar28 = extraout_RDX_08;
      goto LAB_00111a8f;
    }
    lVar40 = lVar40 + 1;
    iVar16 = psVar34->img_n;
    lVar30 = (long)iVar16;
    piVar37 = piVar37 + 0x18;
  } while (lVar40 < lVar30);
  sVar5 = psVar34->img_x;
  sVar6 = psVar34->img_y;
  iVar17 = stbi__mad3sizes_valid(sVar5,sVar6,iVar16,0);
  paVar28 = extraout_RDX_09;
  if (iVar17 == 0) goto LAB_00111a6d;
  if (iVar16 < 1) {
    uVar25 = 1;
    uVar26 = 1;
  }
  else {
    uVar25 = 1;
    lVar40 = 0;
    uVar26 = 1;
    do {
      uVar18 = *(uint *)((long)&j->img_comp[0].h + lVar40);
      uVar35 = *(uint *)((long)&j->img_comp[0].v + lVar40);
      if ((int)uVar26 < (int)uVar18) {
        uVar26 = (ulong)uVar18;
      }
      if ((int)uVar25 < (int)uVar35) {
        uVar25 = uVar35;
      }
      lVar40 = lVar40 + 0x60;
    } while (lVar30 * 0x60 != lVar40);
    lVar40 = 0;
    do {
      uVar36 = (long)(int)uVar26 % (long)*(int *)((long)&j->img_comp[0].h + lVar40);
      paVar28 = (anon_struct_96_18_0d0905d3 *)(uVar36 & 0xffffffff);
      if ((int)uVar36 != 0) goto LAB_00111c55;
      uVar36 = (long)(int)uVar25 % (long)*(int *)((long)&j->img_comp[0].v + lVar40);
      paVar28 = (anon_struct_96_18_0d0905d3 *)(uVar36 & 0xffffffff);
      if ((int)uVar36 != 0) goto LAB_00111c61;
      lVar40 = lVar40 + 0x60;
    } while (lVar30 * 0x60 != lVar40);
  }
  iVar17 = (int)uVar26;
  uVar35 = ((sVar5 + iVar17 * 8) - 1) / (uint)(iVar17 * 8);
  uVar18 = ((sVar6 + uVar25 * 8) - 1) / (uVar25 * 8);
  j->img_h_max = iVar17;
  j->img_v_max = uVar25;
  j->img_mcu_w = iVar17 * 8;
  j->img_mcu_h = uVar25 * 8;
  j->img_mcu_x = uVar35;
  j->img_mcu_y = uVar18;
  if (0 < iVar16) {
    iVar16 = 1;
    lVar40 = 0;
    do {
      iVar38 = *(int *)((long)&j->img_comp[0].h + lVar40);
      iVar39 = *(int *)((long)&j->img_comp[0].v + lVar40);
      *(int *)((long)&j->img_comp[0].x + lVar40) = (int)((iVar38 * sVar5 + iVar17 + -1) / uVar26);
      *(uint *)((long)&j->img_comp[0].y + lVar40) = (iVar39 * sVar6 + (uVar25 - 1)) / uVar25;
      iVar38 = iVar38 * uVar35;
      iVar33 = iVar38 * 8;
      *(int *)((long)&j->img_comp[0].w2 + lVar40) = iVar33;
      iVar39 = iVar39 * uVar18;
      iVar20 = iVar39 * 8;
      *(int *)((long)&j->img_comp[0].h2 + lVar40) = iVar20;
      pvVar22 = stbi__malloc_mad2(iVar33,iVar20,0xf);
      puVar2 = (undefined8 *)((long)&j->img_comp[0].raw_coeff + lVar40);
      *puVar2 = 0;
      puVar2[1] = 0;
      *(undefined8 *)((long)&j->img_comp[0].coeff + lVar40) = 0;
      *(void **)((long)&j->img_comp[0].raw_data + lVar40) = pvVar22;
      iVar19 = extraout_EDX_00;
      if (pvVar22 == (void *)0x0) {
LAB_00112c07:
        *(char **)(in_FS_OFFSET + -8) = "outofmem";
        stbi__free_jpeg_components(j,iVar16,iVar19);
        uVar25 = extraout_EDX_08;
        goto LAB_00111a98;
      }
      *(ulong *)((long)&j->img_comp[0].data + lVar40) = (long)pvVar22 + 0xfU & 0xfffffffffffffff0;
      if (j->progressive != 0) {
        *(int *)((long)&j->img_comp[0].coeff_w + lVar40) = iVar38;
        *(int *)((long)&j->img_comp[0].coeff_h + lVar40) = iVar39;
        pvVar22 = stbi__malloc_mad3(iVar33,iVar20,2,0xf);
        *(void **)((long)&j->img_comp[0].raw_coeff + lVar40) = pvVar22;
        iVar19 = extraout_EDX_01;
        if (pvVar22 == (void *)0x0) goto LAB_00112c07;
        *(ulong *)((long)&j->img_comp[0].coeff + lVar40) = (long)pvVar22 + 0xfU & 0xfffffffffffffff0
        ;
      }
      iVar16 = iVar16 + 1;
      lVar40 = lVar40 + 0x60;
    } while (lVar30 * 0x60 != lVar40);
  }
  bVar11 = stbi__get_marker(j);
  local_180 = extraout_RDX_10;
LAB_00111e73:
  if (bVar11 == 0xda) {
    psVar34 = j->s;
    sVar10 = stbi__get8(psVar34);
    sVar12 = stbi__get8(psVar34);
    bVar11 = stbi__get8(j->s);
    j->scan_n = (uint)bVar11;
    if (((byte)(bVar11 - 5) < 0xfc) || (psVar34 = j->s, psVar34->img_n < (int)(uint)bVar11)) {
      pcVar21 = "bad SOS component count";
      paVar28 = extraout_RDX_14;
    }
    else {
      paVar28 = (anon_struct_96_18_0d0905d3 *)(ulong)(uint)CONCAT11(sVar10,sVar12);
      if ((uint)CONCAT11(sVar10,sVar12) == (uint)bVar11 * 2 + 6) {
        lVar40 = 0;
        do {
          bVar11 = stbi__get8(psVar34);
          bVar15 = stbi__get8(j->s);
          psVar34 = j->s;
          uVar25 = psVar34->img_n;
          if ((long)(int)uVar25 < 1) {
            uVar26 = 0;
          }
          else {
            uVar26 = 0;
            paVar28 = paVar1;
            while (paVar28->id != (uint)bVar11) {
              uVar26 = uVar26 + 1;
              paVar28 = paVar28 + 1;
              if ((long)(int)uVar25 == uVar26) goto LAB_00111a98;
            }
          }
          if ((uint)uVar26 == uVar25) goto LAB_00111a98;
          uVar36 = uVar26 & 0xffffffff;
          paVar28 = (anon_struct_96_18_0d0905d3 *)(uVar36 * 0x60);
          j->img_comp[uVar36].hd = (uint)(bVar15 >> 4);
          if (0x3f < bVar15) {
            pcVar21 = "bad DC huff";
            goto LAB_00111a8f;
          }
          paVar28 = paVar1 + uVar36;
          paVar28->ha = bVar15 & 0xf;
          if (3 < (bVar15 & 0xf)) {
            pcVar21 = "bad AC huff";
            goto LAB_00111a8f;
          }
          j->order[lVar40] = (uint)uVar26;
          lVar40 = lVar40 + 1;
        } while (lVar40 < j->scan_n);
        bVar11 = stbi__get8(psVar34);
        j->spec_start = (uint)bVar11;
        bVar11 = stbi__get8(j->s);
        j->spec_end = (uint)bVar11;
        bVar11 = stbi__get8(j->s);
        j->succ_high = (uint)(bVar11 >> 4);
        uVar25 = bVar11 & 0xf;
        paVar28 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar25;
        j->succ_low = uVar25;
        iVar16 = j->progressive;
        iVar17 = j->spec_start;
        if (iVar16 != 0) {
          if (((0x3f < iVar17) || (0x3f < j->spec_end)) ||
             ((j->spec_end < iVar17 || ((0xdf < bVar11 || (0xd < uVar25)))))) goto LAB_0011330b;
LAB_0011209e:
          uVar25 = j->scan_n;
          uVar26 = (ulong)uVar25;
          iVar17 = j->restart_interval;
          if (iVar17 == 0) {
            iVar17 = 0x7fffffff;
          }
          j->code_buffer = 0;
          j->code_bits = 0;
          j->nomore = 0;
          j->img_comp[3].dc_pred = 0;
          j->img_comp[2].dc_pred = 0;
          j->img_comp[1].dc_pred = 0;
          j->img_comp[0].dc_pred = 0;
          j->marker = 0xff;
          j->todo = iVar17;
          j->eob_run = 0;
          if (iVar16 == 0) {
            if (uVar25 == 1) {
              iVar16 = j->order[0];
              iVar17 = j->img_comp[iVar16].y + 7 >> 3;
              bVar41 = true;
              uVar25 = 1;
              if (0 < iVar17) {
                uVar18 = paVar1[iVar16].x + 7 >> 3;
                iVar20 = 0;
                iVar38 = 0;
                do {
                  if (0 < (int)uVar18) {
                    lVar40 = 0;
                    do {
                      iVar39 = stbi__jpeg_decode_block
                                         (j,local_f8,j->huff_dc + paVar1[iVar16].hd,
                                          j->huff_ac + paVar1[iVar16].ha,
                                          j->fast_ac[paVar1[iVar16].ha],iVar16,
                                          j->dequant[paVar1[iVar16].tq]);
                      uVar25 = extraout_EDX_03;
                      if (iVar39 == 0) goto LAB_00112b43;
                      (*j->idct_block_kernel)
                                (paVar1[iVar16].data + lVar40 + iVar20 * paVar1[iVar16].w2,
                                 paVar1[iVar16].w2,local_f8);
                      uVar25 = (uint)extraout_RDX_17;
                      iVar39 = j->todo;
                      j->todo = iVar39 + -1;
                      uVar26 = extraout_RDX_17;
                      if (iVar39 < 2) {
                        if (j->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(j);
                          uVar25 = extraout_EDX_04;
                        }
                        if ((j->marker & 0xf8) != 0xd0) goto LAB_00112b4b;
                        j->code_buffer = 0;
                        j->code_bits = 0;
                        j->nomore = 0;
                        j->img_comp[3].dc_pred = 0;
                        j->img_comp[2].dc_pred = 0;
                        j->img_comp[1].dc_pred = 0;
                        j->img_comp[0].dc_pred = 0;
                        j->marker = 0xff;
                        iVar39 = j->restart_interval;
                        uVar26 = 0x7fffffff;
                        if (iVar39 == 0) {
                          iVar39 = 0x7fffffff;
                        }
                        j->todo = iVar39;
                        j->eob_run = 0;
                      }
                      lVar40 = lVar40 + 8;
                    } while ((ulong)uVar18 * 8 != lVar40);
                  }
                  uVar25 = (uint)uVar26;
                  iVar38 = iVar38 + 1;
                  iVar20 = iVar20 + 8;
                } while (iVar38 != iVar17);
              }
            }
            else {
              uVar25 = j->img_mcu_y;
              uVar26 = (ulong)uVar25;
              bVar41 = true;
              if (0 < (int)uVar25) {
                iVar16 = j->img_mcu_x;
                iVar20 = 0;
                do {
                  if (0 < iVar16) {
                    uVar18 = 0;
                    do {
                      uVar25 = (uint)uVar26;
                      iVar16 = j->scan_n;
                      if (0 < iVar16) {
                        local_160 = 0;
                        do {
                          iVar17 = j->order[local_160];
                          iVar38 = j->img_comp[iVar17].v;
                          if (0 < iVar38) {
                            iVar16 = paVar1[iVar17].h;
                            iVar39 = 0;
                            do {
                              if (0 < iVar16) {
                                iVar38 = 0;
                                do {
                                  iVar19 = paVar1[iVar17].v;
                                  iVar33 = stbi__jpeg_decode_block
                                                     (j,local_f8,j->huff_dc + paVar1[iVar17].hd,
                                                      j->huff_ac + paVar1[iVar17].ha,
                                                      j->fast_ac[paVar1[iVar17].ha],iVar17,
                                                      j->dequant[paVar1[iVar17].tq]);
                                  uVar25 = extraout_EDX_06;
                                  if (iVar33 == 0) goto LAB_00112b43;
                                  (*j->idct_block_kernel)
                                            (paVar1[iVar17].data +
                                             (long)(int)((iVar16 * uVar18 + iVar38) * 8) +
                                             (long)((iVar19 * iVar20 + iVar39) * paVar1[iVar17].w2 *
                                                   8),paVar1[iVar17].w2,local_f8);
                                  iVar38 = iVar38 + 1;
                                  iVar16 = paVar1[iVar17].h;
                                } while (iVar38 < iVar16);
                                iVar38 = paVar1[iVar17].v;
                                uVar26 = extraout_RDX_18;
                              }
                              iVar39 = iVar39 + 1;
                            } while (iVar39 < iVar38);
                            iVar16 = j->scan_n;
                          }
                          uVar25 = (uint)uVar26;
                          local_160 = local_160 + 1;
                        } while (local_160 < iVar16);
                        iVar17 = j->todo;
                      }
                      j->todo = iVar17 + -1;
                      bVar8 = iVar17 < 2;
                      iVar17 = iVar17 + -1;
                      if (bVar8) {
                        if (j->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(j);
                          uVar25 = extraout_EDX_07;
                        }
                        if ((j->marker & 0xf8) != 0xd0) goto LAB_00112b4b;
                        j->code_buffer = 0;
                        j->code_bits = 0;
                        j->nomore = 0;
                        j->img_comp[3].dc_pred = 0;
                        j->img_comp[2].dc_pred = 0;
                        j->img_comp[1].dc_pred = 0;
                        j->img_comp[0].dc_pred = 0;
                        j->marker = 0xff;
                        iVar17 = j->restart_interval;
                        if (iVar17 == 0) {
                          iVar17 = 0x7fffffff;
                        }
                        j->todo = iVar17;
                        j->eob_run = 0;
                      }
                      uVar18 = uVar18 + 1;
                      uVar26 = (ulong)uVar18;
                      iVar16 = j->img_mcu_x;
                    } while ((int)uVar18 < iVar16);
                    uVar26 = (ulong)(uint)j->img_mcu_y;
                  }
                  iVar20 = iVar20 + 1;
                  uVar25 = (uint)uVar26;
                } while (iVar20 < (int)uVar25);
              }
            }
            goto LAB_00112b4b;
          }
          if (uVar25 == 1) {
            lVar40 = (long)j->order[0];
            iVar16 = j->img_comp[lVar40].y + 7 >> 3;
            local_108 = lVar40;
            if (0 < iVar16) {
              iVar17 = j->img_comp[lVar40].x + 7 >> 3;
              local_14c = 0;
              do {
                if (0 < iVar17) {
                  iVar20 = 0;
                  do {
                    psVar23 = paVar1[lVar40].coeff +
                              (paVar1[lVar40].coeff_w * local_14c + iVar20) * 0x40;
                    uVar26 = (ulong)j->spec_start;
                    if (uVar26 == 0) {
                      iVar38 = stbi__jpeg_decode_block_prog_dc
                                         (j,psVar23,j->huff_dc + paVar1[lVar40].hd,(int)local_108);
                      uVar25 = extraout_EDX_02;
                      if (iVar38 == 0) goto LAB_00111a98;
                    }
                    else {
                      iVar38 = paVar1[lVar40].ha;
                      iVar39 = j->eob_run;
                      bVar11 = (byte)j->succ_low;
                      if (j->succ_high == 0) {
                        if (iVar39 == 0) {
                          do {
                            if (j->code_bits < 0x10) {
                              stbi__grow_buffer_unsafe(j);
                            }
                            uVar25 = j->code_buffer;
                            paVar28 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar25;
                            sVar27 = j->fast_ac[iVar38][uVar25 >> 0x17];
                            uVar18 = (uint)sVar27;
                            iVar39 = (int)uVar26;
                            if (sVar27 == 0) {
                              uVar25 = stbi__jpeg_huff_decode(j,j->huff_ac + iVar38);
                              paVar28 = extraout_RDX_16;
                              if ((int)uVar25 < 0) goto LAB_001132ff;
                              uVar18 = uVar25 >> 4;
                              if ((uVar25 & 0xf) == 0) {
                                if (uVar25 < 0xf0) {
                                  iVar39 = 1 << ((byte)uVar18 & 0x1f);
                                  j->eob_run = iVar39;
                                  if (0xf < uVar25) {
                                    iVar39 = stbi__jpeg_get_bits(j,uVar18);
                                    iVar39 = iVar39 + j->eob_run;
                                  }
                                  goto LAB_001122aa;
                                }
                                uVar26 = (ulong)(iVar39 + 0x10);
                              }
                              else {
                                uVar26 = (ulong)((int)((long)iVar39 + (ulong)uVar18) + 1);
                                bVar15 = ""[(long)iVar39 + (ulong)uVar18];
                                iVar39 = stbi__extend_receive(j,uVar25 & 0xf);
                                psVar23[bVar15] = (short)(iVar39 << (bVar11 & 0x1f));
                              }
                            }
                            else {
                              uVar35 = uVar18 & 0xf;
                              if (j->code_bits < (int)uVar35) goto LAB_001132ff;
                              lVar30 = (long)iVar39 + (ulong)(uVar18 >> 4 & 0xf);
                              j->code_buffer = uVar25 << (sbyte)uVar35;
                              j->code_bits = j->code_bits - uVar35;
                              uVar26 = (ulong)((int)lVar30 + 1);
                              psVar23[""[lVar30]] = (short)((uVar18 >> 8) << (bVar11 & 0x1f));
                            }
                          } while ((int)uVar26 <= j->spec_end);
                        }
                        else {
LAB_001122aa:
                          j->eob_run = iVar39 + -1;
                        }
                      }
                      else if (iVar39 == 0) {
                        iVar39 = 0x10000 << (bVar11 & 0x1f);
                        do {
                          uVar25 = stbi__jpeg_huff_decode(j,j->huff_ac + iVar38);
                          paVar28 = extraout_RDX_15;
                          if ((int)uVar25 < 0) goto LAB_001132ff;
                          uVar18 = uVar25 >> 4;
                          if ((uVar25 & 0xf) == 1) {
                            iVar33 = stbi__jpeg_get_bit(j);
                            iVar19 = 1;
                            if (iVar33 == 0) {
                              iVar19 = 0xffff;
                            }
                            sVar27 = (short)(iVar19 << (bVar11 & 0x1f));
                          }
                          else {
                            if ((uVar25 & 0xf) != 0) goto LAB_001132ff;
                            if (uVar25 < 0xf0) {
                              j->eob_run = ~(-1 << ((byte)uVar18 & 0x1f));
                              uVar35 = 0x40;
                              if (0xf < uVar25) {
                                iVar19 = stbi__jpeg_get_bits(j,uVar18);
                                j->eob_run = j->eob_run + iVar19;
                              }
                            }
                            else {
                              uVar35 = 0xf;
                            }
                            uVar18 = uVar35;
                            sVar27 = 0;
                          }
                          uVar25 = j->spec_end;
                          uVar36 = (ulong)uVar25;
                          if ((int)uVar26 <= (int)uVar25) {
                            uVar31 = (long)(int)uVar26;
                            do {
                              uVar25 = (uint)uVar36;
                              bVar15 = ""[uVar31];
                              if (psVar23[bVar15] == 0) {
                                if (uVar18 == 0) {
                                  uVar26 = (ulong)((int)uVar31 + 1);
                                  psVar23[bVar15] = sVar27;
                                  break;
                                }
                                uVar18 = uVar18 - 1;
                              }
                              else {
                                iVar19 = stbi__jpeg_get_bit(j);
                                if ((iVar19 != 0) &&
                                   (sVar4 = psVar23[bVar15], (iVar39 >> 0x10 & (int)sVar4) == 0)) {
                                  sVar9 = (short)((uint)iVar39 >> 0x10);
                                  if (sVar4 < 1) {
                                    sVar9 = -sVar9;
                                  }
                                  psVar23[bVar15] = sVar4 + sVar9;
                                }
                              }
                              uVar26 = uVar31 + 1;
                              uVar25 = j->spec_end;
                              uVar36 = (ulong)(int)uVar25;
                              bVar41 = (long)uVar31 < (long)uVar36;
                              uVar31 = uVar26;
                            } while (bVar41);
                          }
                        } while ((int)uVar26 <= (int)uVar25);
                      }
                      else {
                        j->eob_run = iVar39 + -1;
                        if (j->spec_start <= j->spec_end) {
                          uVar25 = (0x10000 << (bVar11 & 0x1f)) >> 0x10;
                          do {
                            bVar11 = ""[uVar26];
                            if (((psVar23[bVar11] != 0) &&
                                (iVar38 = stbi__jpeg_get_bit(j), iVar38 != 0)) &&
                               (sVar27 = psVar23[bVar11], (uVar25 & (int)sVar27) == 0)) {
                              uVar18 = -uVar25;
                              if (0 < sVar27) {
                                uVar18 = uVar25;
                              }
                              psVar23[bVar11] = (short)uVar18 + sVar27;
                            }
                            bVar41 = (long)uVar26 < (long)j->spec_end;
                            uVar26 = uVar26 + 1;
                          } while (bVar41);
                        }
                      }
                    }
                    iVar38 = j->todo;
                    j->todo = iVar38 + -1;
                    if (iVar38 < 2) {
                      if (j->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(j);
                      }
                      bVar11 = j->marker;
                      if ((bVar11 & 0xf8) != 0xd0) goto LAB_00112b5c;
                      j->code_buffer = 0;
                      j->code_bits = 0;
                      j->nomore = 0;
                      j->img_comp[3].dc_pred = 0;
                      j->img_comp[2].dc_pred = 0;
                      j->img_comp[1].dc_pred = 0;
                      j->img_comp[0].dc_pred = 0;
                      j->marker = 0xff;
                      iVar38 = j->restart_interval;
                      if (iVar38 == 0) {
                        iVar38 = 0x7fffffff;
                      }
                      j->todo = iVar38;
                      j->eob_run = 0;
                    }
                    iVar20 = iVar20 + 1;
                  } while (iVar20 != iVar17);
                }
                local_14c = local_14c + 1;
              } while (local_14c != iVar16);
            }
          }
          else {
            iVar16 = j->img_mcu_y;
            if (0 < iVar16) {
              iVar20 = j->img_mcu_x;
              iVar38 = 0;
              do {
                if (0 < iVar20) {
                  iVar16 = 0;
                  do {
                    iVar20 = j->scan_n;
                    if (0 < iVar20) {
                      local_188 = 0;
                      do {
                        iVar17 = j->order[local_188];
                        iVar39 = j->img_comp[iVar17].v;
                        if (0 < iVar39) {
                          iVar20 = paVar1[iVar17].h;
                          iVar19 = 0;
                          do {
                            if (0 < iVar20) {
                              iVar39 = 0;
                              do {
                                iVar20 = stbi__jpeg_decode_block_prog_dc
                                                   (j,paVar1[iVar17].coeff +
                                                      (iVar20 * iVar16 + iVar39 +
                                                      (paVar1[iVar17].v * iVar38 + iVar19) *
                                                      paVar1[iVar17].coeff_w) * 0x40,
                                                    j->huff_dc + paVar1[iVar17].hd,iVar17);
                                uVar25 = extraout_EDX_05;
                                if (iVar20 == 0) goto LAB_00111a98;
                                iVar39 = iVar39 + 1;
                                iVar20 = paVar1[iVar17].h;
                              } while (iVar39 < iVar20);
                              iVar39 = paVar1[iVar17].v;
                            }
                            iVar19 = iVar19 + 1;
                          } while (iVar19 < iVar39);
                          iVar20 = j->scan_n;
                        }
                        local_188 = local_188 + 1;
                      } while (local_188 < iVar20);
                      iVar17 = j->todo;
                    }
                    j->todo = iVar17 + -1;
                    bVar41 = iVar17 < 2;
                    iVar17 = iVar17 + -1;
                    if (bVar41) {
                      if (j->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(j);
                      }
                      bVar11 = j->marker;
                      if ((bVar11 & 0xf8) != 0xd0) goto LAB_00112b5c;
                      j->code_buffer = 0;
                      j->code_bits = 0;
                      j->nomore = 0;
                      j->img_comp[3].dc_pred = 0;
                      j->img_comp[2].dc_pred = 0;
                      j->img_comp[1].dc_pred = 0;
                      j->img_comp[0].dc_pred = 0;
                      j->marker = 0xff;
                      iVar17 = j->restart_interval;
                      if (iVar17 == 0) {
                        iVar17 = 0x7fffffff;
                      }
                      j->todo = iVar17;
                      j->eob_run = 0;
                    }
                    iVar16 = iVar16 + 1;
                    iVar20 = j->img_mcu_x;
                  } while (iVar16 < iVar20);
                  iVar16 = j->img_mcu_y;
                }
                iVar38 = iVar38 + 1;
              } while (iVar38 < iVar16);
            }
          }
          goto LAB_00112b56;
        }
        if (((iVar17 == 0) && (bVar11 < 0x10)) && ((bVar11 & 0xf) == 0)) {
          j->spec_end = 0x3f;
          goto LAB_0011209e;
        }
LAB_0011330b:
        pcVar21 = "bad SOS";
      }
      else {
        pcVar21 = "bad SOS len";
      }
    }
    goto LAB_00111a8f;
  }
  uVar25 = (uint)bVar11;
  if (uVar25 == 0xdc) {
    psVar34 = j->s;
    sVar10 = stbi__get8(psVar34);
    sVar12 = stbi__get8(psVar34);
    psVar34 = j->s;
    sVar13 = stbi__get8(psVar34);
    sVar14 = stbi__get8(psVar34);
    paVar28 = extraout_RDX_12;
    if (CONCAT11(sVar10,sVar12) != 4) {
      pcVar21 = "bad DNL len";
      goto LAB_00111a8f;
    }
    if ((uint)CONCAT11(sVar13,sVar14) != j->s->img_y) {
      pcVar21 = "bad DNL height";
      goto LAB_00111a8f;
    }
    goto LAB_00111efa;
  }
  if (uVar25 == 0xd9) {
    psVar34 = j->s;
    if ((j->progressive != 0) && (0 < psVar34->img_n)) {
      local_180 = 0;
      do {
        iVar16 = j->img_comp[local_180].y + 7 >> 3;
        if (0 < iVar16) {
          uVar25 = paVar1[local_180].x + 7 >> 3;
          iVar17 = 0;
          do {
            if (0 < (int)uVar25) {
              uVar26 = 0;
              do {
                psVar23 = paVar1[local_180].coeff +
                          (paVar1[local_180].coeff_w * iVar17 + (int)uVar26) * 0x40;
                iVar20 = paVar1[local_180].tq;
                lVar40 = 0;
                do {
                  psVar23[lVar40] = psVar23[lVar40] * j->dequant[iVar20][lVar40];
                  lVar40 = lVar40 + 1;
                } while (lVar40 != 0x40);
                (*j->idct_block_kernel)
                          (paVar1[local_180].data +
                           uVar26 * 8 + (long)(iVar17 * 8 * paVar1[local_180].w2),
                           paVar1[local_180].w2,psVar23);
                uVar26 = uVar26 + 1;
              } while (uVar26 != uVar25);
            }
            iVar17 = iVar17 + 1;
          } while (iVar17 != iVar16);
          psVar34 = j->s;
        }
        local_180 = local_180 + 1;
      } while (local_180 < psVar34->img_n);
    }
  }
  else {
    iVar16 = stbi__process_marker(j,uVar25);
    if (iVar16 != 0) goto LAB_00111efa;
    psVar34 = j->s;
    local_180 = extraout_RDX_11;
  }
  uVar25 = (uint)local_180;
  uVar18 = psVar34->img_n;
  uVar26 = (ulong)uVar18;
  if (uVar26 != 3) {
    if (0 < (int)uVar18) {
LAB_00112d99:
      bVar41 = false;
      goto LAB_00112da1;
    }
    goto LAB_00111aa1;
  }
  bVar41 = true;
  if (j->rgb != 3) {
    if (j->app14_color_transform != 0) goto LAB_00112d99;
    bVar41 = j->jfif == 0;
  }
LAB_00112da1:
  local_138[2] = (stbi_uc *)0x0;
  lStack_120 = 0;
  local_138[0] = (stbi_uc *)0x0;
  local_138[1] = (stbi_uc *)0x0;
  sVar5 = psVar34->img_x;
  lVar40 = 0;
  uVar36 = uVar26;
  do {
    pvVar22 = malloc((ulong)(sVar5 + 3));
    *(void **)((long)&j->img_comp[0].linebuf + lVar40 * 2) = pvVar22;
    iVar16 = extraout_EDX_09;
    if (pvVar22 == (void *)0x0) goto LAB_00113269;
    uVar31 = (long)j->img_h_max / (long)*(int *)((long)&j->img_comp[0].h + lVar40 * 2);
    iVar16 = (int)uVar31;
    *(int *)((long)local_e0 + lVar40) = iVar16;
    iVar17 = j->img_v_max / *(int *)((long)&j->img_comp[0].v + lVar40 * 2);
    *(int *)((long)local_e0 + lVar40 + 4) = iVar17;
    *(int *)((long)local_e0 + lVar40 + 0xc) = iVar17 >> 1;
    *(int *)((long)local_e0 + lVar40 + 8) =
         (int)((ulong)((sVar5 - 1) + iVar16) / (uVar31 & 0xffffffff));
    *(undefined4 *)((long)local_e0 + lVar40 + 0x10) = 0;
    uVar7 = *(undefined8 *)((long)&j->img_comp[0].data + lVar40 * 2);
    *(undefined8 *)((long)local_f0 + lVar40 + 8) = uVar7;
    *(undefined8 *)((long)local_f0 + lVar40) = uVar7;
    if (iVar16 == 2) {
      pcVar24 = stbi__resample_row_h_2;
      if (iVar17 != 1) {
        if (iVar17 != 2) goto LAB_00112ea0;
        pcVar24 = j->resample_row_hv_2_kernel;
      }
    }
    else if (iVar16 == 1) {
      pcVar24 = stbi__resample_row_generic;
      if (iVar17 == 2) {
        pcVar24 = stbi__resample_row_v_2;
      }
      if (iVar17 == 1) {
        pcVar24 = resample_row_1;
      }
    }
    else {
LAB_00112ea0:
      pcVar24 = stbi__resample_row_generic;
    }
    *(code **)((long)local_f8 + lVar40) = pcVar24;
    lVar40 = lVar40 + 0x30;
    uVar36 = uVar36 - 1;
  } while (uVar36 != 0);
  sVar6 = psVar34->img_y;
  pvVar22 = stbi__malloc_mad3(4,sVar5,sVar6,1);
  iVar16 = extraout_EDX_10;
  if (pvVar22 != (void *)0x0) {
    if (sVar6 != 0) {
      iVar17 = 0;
      uVar25 = 0;
      do {
        sVar5 = psVar34->img_x;
        piVar37 = local_e0 + 4;
        uVar36 = 0;
        piVar32 = &j->img_comp[0].y;
        do {
          iVar16 = piVar37[-1];
          iVar20 = piVar37[-3];
          iVar38 = iVar20 >> 1;
          auVar42 = (**(code **)(piVar37 + -10))
                              (*(stbi_uc **)(piVar32 + 10),
                               *(undefined8 *)
                                ((long)piVar37 +
                                ((ulong)(iVar38 <= iVar16) << 3 | 0xffffffffffffffe0)),
                               *(undefined8 *)
                                ((long)piVar37 +
                                ((ulong)(iVar16 < iVar38) << 3 | 0xffffffffffffffe0)),piVar37[-2],
                               piVar37[-4]);
          psVar29 = auVar42._8_8_;
          local_138[uVar36] = auVar42._0_8_;
          piVar37[-1] = iVar16 + 1;
          if (iVar20 <= iVar16 + 1) {
            piVar37[-1] = 0;
            *(long *)(piVar37 + -8) = *(long *)(piVar37 + -6);
            iVar16 = *piVar37;
            *piVar37 = iVar16 + 1;
            if (iVar16 + 1 < *piVar32) {
              *(long *)(piVar37 + -6) = *(long *)(piVar37 + -6) + (long)piVar32[1];
            }
          }
          uVar36 = uVar36 + 1;
          piVar32 = piVar32 + 0x18;
          piVar37 = piVar37 + 0xc;
        } while (uVar26 != uVar36);
        psVar3 = (stbi_uc *)((ulong)(uVar25 * sVar5 * 4) + (long)pvVar22);
        psVar34 = j->s;
        if (psVar34->img_n == 3) {
          if (bVar41) {
            if (psVar34->img_x != 0) {
              uVar18 = sVar5 * iVar17;
              psVar29 = (stbi_uc *)0x0;
              do {
                *(stbi_uc *)((long)pvVar22 + (long)psVar29 * 4 + (ulong)uVar18) =
                     local_138[0][(long)psVar29];
                *(stbi_uc *)((long)pvVar22 + (long)psVar29 * 4 + (ulong)uVar18 + 1) =
                     local_138[1][(long)psVar29];
                *(stbi_uc *)((long)pvVar22 + (long)psVar29 * 4 + (ulong)uVar18 + 2) =
                     local_138[2][(long)psVar29];
                *(undefined1 *)((long)pvVar22 + (long)psVar29 * 4 + (ulong)uVar18 + 3) = 0xff;
                psVar29 = psVar29 + 1;
              } while (psVar29 < (stbi_uc *)(ulong)psVar34->img_x);
            }
          }
          else {
LAB_00113159:
            (*j->YCbCr_to_RGB_kernel)
                      (psVar3,local_138[0],local_138[1],local_138[2],psVar34->img_x,4);
            psVar34 = j->s;
            psVar29 = extraout_RDX_20;
          }
        }
        else if (psVar34->img_n == 4) {
          if (j->app14_color_transform == 2) {
            (*j->YCbCr_to_RGB_kernel)
                      (psVar3,local_138[0],local_138[1],local_138[2],psVar34->img_x,4);
            psVar34 = j->s;
            psVar29 = extraout_RDX_21;
            if (psVar34->img_x != 0) {
              uVar18 = sVar5 * iVar17;
              uVar36 = 0;
              do {
                bVar11 = *(byte *)(lStack_120 + uVar36);
                iVar16 = (*(byte *)((long)pvVar22 + uVar36 * 4 + (ulong)uVar18) ^ 0xff) *
                         (uint)bVar11;
                *(char *)((long)pvVar22 + uVar36 * 4 + (ulong)uVar18) =
                     (char)((iVar16 + 0x80U >> 8) + iVar16 + 0x80 >> 8);
                iVar16 = (*(byte *)((long)pvVar22 + uVar36 * 4 + (ulong)uVar18 + 1) ^ 0xff) *
                         (uint)bVar11;
                *(char *)((long)pvVar22 + uVar36 * 4 + (ulong)uVar18 + 1) =
                     (char)(iVar16 + (iVar16 + 0x80U >> 8) + 0x80 >> 8);
                iVar16 = (*(byte *)((long)pvVar22 + uVar36 * 4 + (ulong)uVar18 + 2) ^ 0xff) *
                         (uint)bVar11;
                uVar35 = iVar16 + 0x80U >> 8;
                *(char *)((long)pvVar22 + uVar36 * 4 + (ulong)uVar18 + 2) =
                     (char)(iVar16 + uVar35 + 0x80 >> 8);
                uVar36 = uVar36 + 1;
                psVar29 = (stbi_uc *)(ulong)uVar35;
              } while (uVar36 < psVar34->img_x);
            }
          }
          else {
            if (j->app14_color_transform != 0) goto LAB_00113159;
            if (psVar34->img_x != 0) {
              uVar18 = sVar5 * iVar17;
              uVar36 = 0;
              do {
                bVar11 = *(byte *)(lStack_120 + uVar36);
                iVar16 = (uint)local_138[0][uVar36] * (uint)bVar11;
                *(char *)((long)pvVar22 + uVar36 * 4 + (ulong)uVar18) =
                     (char)((iVar16 + 0x80U >> 8) + iVar16 + 0x80 >> 8);
                iVar16 = (uint)local_138[1][uVar36] * (uint)bVar11;
                *(char *)((long)pvVar22 + uVar36 * 4 + (ulong)uVar18 + 1) =
                     (char)(iVar16 + (iVar16 + 0x80U >> 8) + 0x80 >> 8);
                *(char *)((long)pvVar22 + uVar36 * 4 + (ulong)uVar18 + 2) =
                     (char)((uint)local_138[2][uVar36] * (uint)bVar11 +
                            ((uint)local_138[2][uVar36] * (uint)bVar11 + 0x80 >> 8) + 0x80 >> 8);
                *(undefined1 *)((long)pvVar22 + uVar36 * 4 + (ulong)uVar18 + 3) = 0xff;
                uVar36 = uVar36 + 1;
                psVar29 = local_138[2];
              } while (uVar36 < psVar34->img_x);
            }
          }
        }
        else if (psVar34->img_x != 0) {
          psVar29 = (stbi_uc *)((long)pvVar22 + (ulong)(sVar5 * iVar17) + 3);
          uVar36 = 0;
          do {
            sVar10 = local_138[0][uVar36];
            psVar29[uVar36 * 4 + -1] = sVar10;
            psVar29[uVar36 * 4 + -2] = sVar10;
            psVar29[uVar36 * 4 + -3] = sVar10;
            psVar29[uVar36 * 4] = 0xff;
            uVar36 = uVar36 + 1;
          } while (uVar36 < psVar34->img_x);
        }
        iVar16 = (int)psVar29;
        uVar25 = uVar25 + 1;
        iVar17 = iVar17 + 4;
      } while (uVar25 < psVar34->img_y);
    }
    stbi__free_jpeg_components(j,psVar34->img_n,iVar16);
    psVar34 = j->s;
    *x = psVar34->img_x;
    *local_100 = psVar34->img_y;
    if (local_110 != (int *)0x0) {
      *local_110 = (uint)(2 < psVar34->img_n) * 2 + 1;
    }
    goto LAB_00111aa8;
  }
LAB_00113269:
  stbi__free_jpeg_components(j,psVar34->img_n,iVar16);
  *(char **)(in_FS_OFFSET + -8) = "outofmem";
  goto LAB_00111aa6;
code_r0x00111964:
  iVar16 = (*(psVar34->io).eof)(psVar34->io_user_data);
  if (iVar16 != 0) {
    paVar28 = extraout_RDX_01;
    if (psVar34->read_from_callbacks != 0) {
LAB_0011197b:
      if (psVar34->img_buffer < psVar34->img_buffer_end) goto LAB_0011194e;
    }
    pcVar21 = "no SOF";
    goto LAB_00111a8f;
  }
  goto LAB_0011194e;
LAB_00111c55:
  pcVar21 = "bad H";
  goto LAB_00111a8f;
LAB_00112b43:
  bVar41 = false;
LAB_00112b4b:
  if (!bVar41) goto LAB_00111a98;
LAB_00112b56:
  bVar11 = j->marker;
LAB_00112b5c:
  if (bVar11 == 0xff) {
    while (psVar34 = j->s, (psVar34->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00112bcf:
      if (psVar34->img_buffer_end <= psVar34->img_buffer) goto LAB_00112bdf;
LAB_00112b66:
      sVar10 = stbi__get8(j->s);
      while (sVar10 == 0xff) {
        psVar34 = j->s;
        if ((psVar34->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00112b8f:
          if (psVar34->img_buffer_end <= psVar34->img_buffer) goto LAB_00112bdf;
        }
        else {
          iVar16 = (*(psVar34->io).eof)(psVar34->io_user_data);
          if (iVar16 != 0) {
            if (psVar34->read_from_callbacks != 0) goto LAB_00112b8f;
            goto LAB_00112bdf;
          }
        }
        sVar10 = stbi__get8(j->s);
        if ((byte)(sVar10 - 1) < 0xfe) goto LAB_00112be1;
      }
    }
    iVar16 = (*(psVar34->io).eof)(psVar34->io_user_data);
    if (iVar16 == 0) goto LAB_00112b66;
    if (psVar34->read_from_callbacks != 0) goto LAB_00112bcf;
LAB_00112bdf:
    sVar10 = 0xff;
LAB_00112be1:
    j->marker = sVar10;
  }
  bVar11 = stbi__get_marker(j);
  local_180 = extraout_RDX_19;
  if ((bVar11 & 0xf8) != 0xd0) goto LAB_00111e73;
LAB_00111efa:
  bVar11 = stbi__get_marker(j);
  local_180 = extraout_RDX_13;
  goto LAB_00111e73;
LAB_001132ff:
  pcVar21 = "bad huffman code";
  goto LAB_00111a8f;
LAB_00111c61:
  pcVar21 = "bad V";
LAB_00111a8f:
  uVar25 = (uint)paVar28;
  *(char **)(in_FS_OFFSET + -8) = pcVar21;
LAB_00111a98:
  uVar18 = j->s->img_n;
LAB_00111aa1:
  stbi__free_jpeg_components(j,uVar18,uVar25);
LAB_00111aa6:
  pvVar22 = (void *)0x0;
LAB_00111aa8:
  free(j);
  return pvVar22;
}

Assistant:

static void *stbi__jpeg_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   unsigned char* result;
   stbi__jpeg* j = (stbi__jpeg*) stbi__malloc(sizeof(stbi__jpeg));
   if (!j) return stbi__errpuc("outofmem", "Out of memory");
   memset(j, 0, sizeof(stbi__jpeg));
   STBI_NOTUSED(ri);
   j->s = s;
   stbi__setup_jpeg(j);
   result = load_jpeg_image(j, x,y,comp,req_comp);
   STBI_FREE(j);
   return result;
}